

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObject::dumpObjectInfo(QObject *this)

{
  QObjectData *pQVar1;
  QObject *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  long lVar5;
  qsizetype qVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  char *pcVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  QMetaObject *this_00;
  __sighandler_t __handler;
  char *extraout_RDX;
  char *pcVar10;
  _func_int **pp_Var11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  QMetaMethod local_148;
  QArrayDataPointer<char> local_128;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QMessageLogger local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.context.version = 2;
  local_68.context.function._4_4_ = 0;
  local_68.context.line = 0;
  local_68.context.file._0_4_ = 0;
  local_68.context.file._4_4_ = 0;
  local_68.context.function._0_4_ = 0;
  local_68.context.category = "default";
  iVar7 = (**this->_vptr_QObject)();
  pcVar8 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar7));
  objectName((QString *)&local_88,this);
  qVar6 = local_88.size;
  if (local_88.size == 0) {
    pcVar9 = "unnamed";
  }
  else {
    objectName((QString *)&local_b8,this);
    QString::toLocal8Bit((QByteArray *)&local_a0,(QString *)&local_b8);
    pcVar9 = QByteArray::data((QByteArray *)&local_a0);
  }
  QMessageLogger::debug(&local_68,"OBJECT %s::%s",pcVar8,pcVar9);
  if (qVar6 != 0) {
    QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  pQVar1 = (this->d_ptr).d;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)local_48,
             (QBasicMutex *)
             ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
             ((ulong)this & 0xffffffff) % 0x418));
  local_68.context.version = 2;
  local_68.context.line = 0;
  local_68.context.file._0_4_ = 0;
  local_68.context.file._4_4_ = 0;
  local_68.context.function._0_4_ = 0;
  local_68.context.function._4_4_ = 0;
  local_68.context.category = "default";
  QMessageLogger::debug(&local_68,"  SIGNALS OUT");
  pQVar2 = pQVar1[1].parent;
  if (((pQVar2 == (QObject *)0x0) || ((pQVar2->d_ptr).d == (QObjectData *)0x0)) ||
     (*(int *)&((pQVar2->d_ptr).d)->q_ptr < 1)) {
    local_68.context.version = 2;
    local_68.context.line = 0;
    local_68.context.file._0_4_ = 0;
    local_68.context.file._4_4_ = 0;
    local_68.context.function._0_4_ = 0;
    local_68.context.function._4_4_ = 0;
    local_68.context.category = "default";
    QMessageLogger::debug(&local_68,"        <None>");
  }
  else {
    pQVar1 = (pQVar2->d_ptr).d;
    for (__handler = (__sighandler_t)0x0; (long)__handler < (long)*(int *)&pQVar1->q_ptr;
        __handler = __handler + 1) {
      pQVar12 = (QObject *)(&(pQVar1->children).d.ptr)[(long)__handler * 2];
      if (pQVar12 != (QObject *)0x0) {
        local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_128.ptr = &DAT_aaaaaaaaaaaaaaaa;
        iVar7 = (**this->_vptr_QObject)();
        local_128.d = (Data *)QMetaObjectPrivate::signal(iVar7,__handler);
        local_68.context.version = 2;
        local_68.context.line = 0;
        local_68.context.file._0_4_ = 0;
        local_68.context.file._4_4_ = 0;
        local_68.context.function._0_4_ = 0;
        local_68.context.function._4_4_ = 0;
        local_68.context.category = "default";
        local_128.ptr = extraout_RDX;
        QMetaMethod::methodSignature((QByteArray *)&local_88,(QMetaMethod *)&local_128);
        pcVar8 = (char *)local_88.ptr;
        if (local_88.ptr == (char16_t *)0x0) {
          pcVar8 = &QByteArray::_empty;
        }
        QMessageLogger::debug(&local_68,"        signal: %s",pcVar8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
LAB_0028f11f:
        do {
          if (pQVar12 == (QObject *)0x0) break;
          if (pQVar12[2].d_ptr.d == (QObjectData *)0x0) {
            local_68.context.version = 2;
            local_68.context.line = 0;
            local_68.context.file._0_4_ = 0;
            local_68.context.file._4_4_ = 0;
            local_68.context.function._0_4_ = 0;
            local_68.context.function._4_4_ = 0;
            local_68.context.category = "default";
            QMessageLogger::debug(&local_68,"          <Disconnected receiver>");
          }
          else {
            if (((ulong)pQVar12[5]._vptr_QObject & 0x2000000000000000) == 0) {
              iVar7 = (**(pQVar12[2].d_ptr.d)->_vptr_QObjectData)();
              local_148.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
              local_148.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
              local_148 = QMetaObject::method((QMetaObject *)CONCAT44(extraout_var_00,iVar7),
                                              (uint)*(ushort *)((long)&pQVar12[5]._vptr_QObject + 2)
                                              + (uint)*(ushort *)&pQVar12[5]._vptr_QObject);
              local_68.context.version = 2;
              local_68.context.line = 0;
              local_68.context.file._0_4_ = 0;
              local_68.context.file._4_4_ = 0;
              local_68.context.function._0_4_ = 0;
              local_68.context.function._4_4_ = 0;
              local_68.context.category = "default";
              pcVar9 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar7));
              objectName((QString *)&local_88,(QObject *)pQVar12[2].d_ptr.d);
              qVar6 = local_88.size;
              pcVar8 = "unnamed";
              if (local_88.size != 0) {
                objectName((QString *)&local_e8,(QObject *)pQVar12[2].d_ptr.d);
                QString::toLocal8Bit((QByteArray *)&local_d0,(QString *)&local_e8);
                pcVar8 = local_d0.ptr;
                if (local_d0.ptr == (char *)0x0) {
                  pcVar8 = &QByteArray::_empty;
                }
              }
              QMetaMethod::methodSignature((QByteArray *)&local_108,&local_148);
              pcVar10 = (char *)local_108.ptr;
              if (local_108.ptr == (char16_t *)0x0) {
                pcVar10 = &QByteArray::_empty;
              }
              QMessageLogger::debug(&local_68,"          --> %s::%s %s",pcVar9,pcVar8,pcVar10);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_108);
              if (qVar6 != 0) {
                QArrayDataPointer<char>::~QArrayDataPointer(&local_d0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
              pQVar12 = (QObject *)pQVar12[1]._vptr_QObject;
              goto LAB_0028f11f;
            }
            local_68.context.version = 2;
            local_68.context.line = 0;
            local_68.context.file._0_4_ = 0;
            local_68.context.file._4_4_ = 0;
            local_68.context.function._0_4_ = 0;
            local_68.context.function._4_4_ = 0;
            local_68.context.category = "default";
            QMessageLogger::debug(&local_68,"          <functor or function pointer>");
          }
          pQVar12 = (QObject *)pQVar12[1]._vptr_QObject;
        } while( true );
      }
    }
  }
  local_68.context.version = 2;
  local_68.context.line = 0;
  local_68.context.file._0_4_ = 0;
  local_68.context.file._4_4_ = 0;
  local_68.context.function._0_4_ = 0;
  local_68.context.function._4_4_ = 0;
  local_68.context.category = "default";
  QMessageLogger::debug(&local_68,"  SIGNALS IN");
  if ((pQVar2 == (QObject *)0x0) ||
     (pp_Var11 = pQVar2[1]._vptr_QObject, pp_Var11 == (_func_int **)0x0)) {
    local_68.context.version = 2;
    local_68.context.line = 0;
    local_68.context.file._0_4_ = 0;
    local_68.context.file._4_4_ = 0;
    local_68.context.function._0_4_ = 0;
    local_68.context.function._4_4_ = 0;
    local_68.context.category = "default";
    QMessageLogger::debug(&local_68,"        <None>");
  }
  else {
    for (; pp_Var11 != (_func_int **)0x0; pp_Var11 = (_func_int **)*pp_Var11) {
      local_68.context.version = 0;
      local_68.context.line = 0;
      local_68.context.file._0_4_ = 0;
      local_68.context.file._4_4_ = 0;
      local_88.d = (Data *)0x0;
      local_88.ptr = L"<unknown>";
      local_68.context.function._0_4_ = 0;
      local_68.context.function._4_4_ = 0;
      local_88.size = 9;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
      if ((*(byte *)((long)pp_Var11 + 0x57) & 0x20) == 0) {
        local_108.ptr._0_4_ = 0xaaaaaaaa;
        local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_108.ptr._4_4_ = 0xaaaaaaaa;
        iVar7 = (**this->_vptr_QObject)();
        local_108._0_16_ =
             QMetaObject::method((QMetaObject *)CONCAT44(extraout_var_01,iVar7),
                                 (uint)*(ushort *)((long)pp_Var11 + 0x52) +
                                 (uint)*(ushort *)(pp_Var11 + 10));
        QMetaMethod::methodSignature((QByteArray *)&local_68,(QMetaMethod *)&local_108);
        pDVar3 = (Data *)CONCAT44(local_68.context.line,local_68.context.version);
        pcVar4 = (char16_t *)CONCAT44(local_68.context.file._4_4_,local_68.context.file._0_4_);
        local_68.context.version = (int)local_88.d;
        local_68.context.line = (int)((ulong)local_88.d >> 0x20);
        local_68.context.file._0_4_ = SUB84(local_88.ptr,0);
        local_68.context.file._4_4_ = (undefined4)((ulong)local_88.ptr >> 0x20);
        lVar5 = CONCAT44(local_68.context.function._4_4_,local_68.context.function._0_4_);
        local_68.context.function._0_4_ = (undefined4)local_88.size;
        local_68.context.function._4_4_ = (undefined4)((ulong)local_88.size >> 0x20);
        local_88.d = pDVar3;
        local_88.ptr = pcVar4;
        local_88.size = lVar5;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
      }
      local_68.context.version = 2;
      local_68.context.function._4_4_ = 0;
      local_68.context.line = 0;
      local_68.context.file._0_4_ = 0;
      local_68.context.file._4_4_ = 0;
      local_68.context.function._0_4_ = 0;
      local_68.context.category = "default";
      this_00 = (QMetaObject *)(*(code *)**(undefined8 **)pp_Var11[4])();
      pcVar9 = QMetaObject::className(this_00);
      objectName((QString *)&local_108,(QObject *)pp_Var11[4]);
      qVar6 = local_108.size;
      pcVar8 = "unnamed";
      if (local_108.size != 0) {
        objectName((QString *)&local_148,(QObject *)pp_Var11[4]);
        QString::toLocal8Bit((QByteArray *)&local_128,(QString *)&local_148);
        pcVar8 = local_128.ptr;
        if (local_128.ptr == (char *)0x0) {
          pcVar8 = &QByteArray::_empty;
        }
      }
      pcVar10 = (char *)local_88.ptr;
      if (local_88.ptr == (char16_t *)0x0) {
        pcVar10 = &QByteArray::_empty;
      }
      QMessageLogger::debug(&local_68,"          <-- %s::%s %s",pcVar9,pcVar8,pcVar10);
      if (qVar6 != 0) {
        QArrayDataPointer<char>::~QArrayDataPointer(&local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
    }
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObject::dumpObjectInfo() const
{
    qDebug("OBJECT %s::%s", metaObject()->className(),
           objectName().isEmpty() ? "unnamed" : objectName().toLocal8Bit().data());

    Q_D(const QObject);
    QMutexLocker locker(signalSlotLock(this));

    // first, look for connections where this object is the sender
    qDebug("  SIGNALS OUT");

    QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
    if (cd && cd->signalVectorCount() > 0) {
        QObjectPrivate::SignalVector *signalVector = cd->signalVector.loadRelaxed();
        for (int signal_index = 0; signal_index < signalVector->count(); ++signal_index) {
            const QObjectPrivate::Connection *c = signalVector->at(signal_index).first.loadRelaxed();
            if (!c)
                continue;
            const QMetaMethod signal = QMetaObjectPrivate::signal(metaObject(), signal_index);
            qDebug("        signal: %s", signal.methodSignature().constData());

            // receivers
            while (c) {
                if (!c->receiver.loadRelaxed()) {
                    qDebug("          <Disconnected receiver>");
                    c = c->nextConnectionList.loadRelaxed();
                    continue;
                }
                if (c->isSlotObject) {
                    qDebug("          <functor or function pointer>");
                    c = c->nextConnectionList.loadRelaxed();
                    continue;
                }
                const QMetaObject *receiverMetaObject = c->receiver.loadRelaxed()->metaObject();
                const QMetaMethod method = receiverMetaObject->method(c->method());
                qDebug("          --> %s::%s %s",
                       receiverMetaObject->className(),
                       c->receiver.loadRelaxed()->objectName().isEmpty() ? "unnamed" : qPrintable(c->receiver.loadRelaxed()->objectName()),
                       method.methodSignature().constData());
                c = c->nextConnectionList.loadRelaxed();
            }
        }
    } else {
        qDebug( "        <None>" );
    }

    // now look for connections where this object is the receiver
    qDebug("  SIGNALS IN");

    if (cd && cd->senders) {
        for (QObjectPrivate::Connection *s = cd->senders; s; s = s->next) {
            QByteArray slotName = QByteArrayLiteral("<unknown>");
            if (!s->isSlotObject) {
                const QMetaMethod slot = metaObject()->method(s->method());
                slotName = slot.methodSignature();
            }
            qDebug("          <-- %s::%s %s",
                   s->sender->metaObject()->className(),
                   s->sender->objectName().isEmpty() ? "unnamed" : qPrintable(s->sender->objectName()),
                   slotName.constData());
        }
    } else {
        qDebug("        <None>");
    }
}